

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim.cpp
# Opt level: O1

void __thiscall amrex::algoim::compute_integrals(algoim *this,MultiFab *intgmf,IntVect nghost)

{
  double dVar1;
  double dVar2;
  EBCellFlagFab *this_00;
  int iVar3;
  EBCellFlag *pEVar4;
  byte bVar5;
  FabType FVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int dim;
  undefined8 *puVar13;
  byte bVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  void *__s;
  bool bVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  int iVar29;
  GpuArray<amrex::algoim::PsiCode<3>,_4U> psi;
  EBPlane phi;
  MFIter mfi;
  MFItInfo mfi_info;
  QuadratureRule q;
  long local_22e8;
  GpuArray<bool,_3U> local_22d4;
  ulong local_22d0;
  long local_22c8;
  long local_22c0;
  int local_22b4;
  GpuArray<amrex::algoim::PsiCode<3>,_4U> local_22b0;
  Box local_22ac;
  long local_2290;
  long local_2288;
  IntVect local_2280;
  Array4<double> local_2270;
  ulong local_2230;
  long local_2228;
  FabArray<amrex::FArrayBox> *local_2220;
  long local_2218;
  MultiCutFab *local_2210;
  MultiCutFab *local_2208;
  FabArray<amrex::EBCellFlagFab> *local_2200;
  long local_21f8;
  long local_21f0;
  EBCellFlag *local_21e8;
  ulong local_21e0;
  long local_21d8;
  long local_21d0;
  long local_21c8;
  EBCellFlag *local_21c0;
  int local_21b8;
  undefined4 uStack_21b4;
  undefined4 uStack_21b0;
  undefined4 uStack_21ac;
  EBPlane local_21a0;
  Array4<const_double> local_2170;
  Array4<const_double> local_2130;
  MFIter local_20f0;
  ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false> local_2090;
  MFItInfo local_204c;
  QuadratureRule local_2038;
  
  iVar17 = (int)*(undefined8 *)(this + 0xc0);
  local_2280.vect[0] = (int)intgmf;
  if (iVar17 <= (int)intgmf) {
    local_2280.vect[0] = iVar17;
  }
  local_2280.vect[1] = (int)((ulong)intgmf >> 0x20);
  iVar17 = (int)((ulong)*(undefined8 *)(this + 0xc0) >> 0x20);
  if (local_2280.vect[1] < iVar17) {
    iVar17 = local_2280.vect[1];
  }
  local_2280.vect[1] = iVar17;
  local_2280.vect[2] = nghost.vect[0];
  if (*(int *)(this + 200) < nghost.vect[0]) {
    local_2280.vect[2] = *(int *)(this + 200);
  }
  local_2220 = (FabArray<amrex::FArrayBox> *)this;
  lVar9 = __dynamic_cast(*(undefined8 *)(this + 0xf0),&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar9 != 0) {
    local_2208 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar9 + 0xd8));
    local_2210 = EBDataCollection::getBndryNormal(*(EBDataCollection **)(lVar9 + 0xd8));
    local_2200 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar9 + 0xd8));
    local_204c.num_streams = Gpu::Device::max_gpu_streams;
    local_204c.do_tiling = true;
    local_204c.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
    local_204c.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
    local_204c.tilesize.vect[2] = DAT_00753ec0;
    local_204c.dynamic = true;
    local_204c.device_sync = true;
    MFIter::MFIter(&local_20f0,&local_2220->super_FabArrayBase,&local_204c);
    if (local_20f0.currentIndex < local_20f0.endIndex) {
      local_21b8 = -0x80000000;
      uStack_21b4 = 0x80000000;
      uStack_21b0 = 0x80000000;
      uStack_21ac = 0x80000000;
      do {
        MFIter::growntilebox(&local_22ac,&local_20f0,&local_2280);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2270,local_2220,&local_20f0);
        piVar10 = &local_20f0.currentIndex;
        if (local_20f0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar10 = ((local_20f0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_20f0.currentIndex;
        }
        this_00 = (local_2200->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar10];
        FVar6 = EBCellFlagFab::getType(this_00,&local_22ac);
        iVar8 = local_22ac.bigend.vect[0];
        iVar29 = local_22ac.smallend.vect[2];
        iVar17 = local_22ac.smallend.vect[0];
        if (FVar6 == regular) {
          local_22c8 = CONCAT44(local_22c8._4_4_,local_22ac.bigend.vect[2]);
          if (local_22ac.smallend.vect[2] <= local_22ac.bigend.vect[2]) {
            local_22d0 = (ulong)(uint)local_22ac.bigend.vect[1];
            local_22c0 = (long)local_22ac.smallend.vect[0] * 8;
            iVar17 = local_22ac.smallend.vect[2];
            do {
              if (local_22ac.smallend.vect[1] <= local_22ac.bigend.vect[1]) {
                lVar22 = (long)local_2270.p +
                         ((long)iVar17 - (long)local_2270.begin.z) * local_2270.kstride * 8 +
                         ((long)local_22ac.smallend.vect[1] - (long)local_2270.begin.y) *
                         local_2270.jstride * 8 + (long)local_2270.begin.x * -8 + local_22c0;
                lVar9 = (long)local_22ac.smallend.vect[1];
                do {
                  if (local_22ac.smallend.vect[0] <= local_22ac.bigend.vect[0]) {
                    lVar23 = 0;
                    do {
                      puVar13 = (undefined8 *)(lVar22 + lVar23 * 8);
                      *puVar13 = 0;
                      puVar13[local_2270.nstride] = 0;
                      puVar13[local_2270.nstride * 2] = 0;
                      puVar13[local_2270.nstride * 3] = 0x3fb5555555555555;
                      puVar13[local_2270.nstride * 4] = 0x3fb5555555555555;
                      puVar13[local_2270.nstride * 5] = 0x3fb5555555555555;
                      puVar13[local_2270.nstride * 6] = 0;
                      puVar13[local_2270.nstride * 7] = 0;
                      puVar13[local_2270.nstride * 8] = 0;
                      puVar13[local_2270.nstride * 9] = 0;
                      puVar13[local_2270.nstride * 10] = 0;
                      puVar13[local_2270.nstride * 0xb] = 0;
                      puVar13[local_2270.nstride * 0xc] = 0;
                      puVar13[local_2270.nstride * 0xd] = 0;
                      puVar13[local_2270.nstride * 0xe] = 0;
                      puVar13[local_2270.nstride * 0xf] = 0x3f7c71c71c71c71c;
                      puVar13[local_2270.nstride * 0x10] = 0x3f7c71c71c71c71c;
                      puVar13[local_2270.nstride * 0x11] = 0x3f7c71c71c71c71c;
                      puVar13[local_2270.nstride * 0x12] = 0;
                      lVar23 = lVar23 + 1;
                    } while ((local_22ac.bigend.vect[0] - local_22ac.smallend.vect[0]) + 1 !=
                             (int)lVar23);
                  }
                  lVar9 = lVar9 + 1;
                  lVar22 = lVar22 + local_2270.jstride * 8;
                } while (local_22ac.bigend.vect[1] + 1U != (int)lVar9);
              }
              bVar24 = iVar17 != local_22ac.bigend.vect[2];
              iVar17 = iVar17 + 1;
            } while (bVar24);
          }
        }
        else if (FVar6 == covered) {
          local_22c8 = (long)local_22ac.smallend.vect[1];
          local_22d0 = CONCAT44(local_22d0._4_4_,local_22ac.bigend.vect[2]);
          local_2228 = (long)local_22ac.smallend.vect[0] << 3;
          uVar7 = local_22ac.bigend.vect[0] - local_22ac.smallend.vect[0];
          local_22c0 = CONCAT44(local_22c0._4_4_,local_22ac.bigend.vect[1]);
          local_2290 = CONCAT44(local_2290._4_4_,
                                (local_22ac.bigend.vect[1] - local_22ac.smallend.vect[1]) + 1);
          local_2288 = 0;
          uVar11 = 0;
          do {
            local_2230 = uVar11;
            iVar3 = iVar29;
            if (iVar29 <= (int)local_22d0) {
              do {
                if ((int)local_22c8 <= (int)local_22c0) {
                  lVar9 = local_2270.jstride * 8;
                  __s = (void *)((long)local_2270.p +
                                local_2270.nstride * local_2288 +
                                (local_22c8 - local_2270.begin.y) * lVar9 +
                                (iVar3 - local_2270.begin.z) * local_2270.kstride * 8 +
                                (long)local_2270.begin.x * -8 + local_2228);
                  iVar16 = (int)local_2290;
                  do {
                    if (iVar17 <= iVar8) {
                      memset(__s,0,(ulong)uVar7 * 8 + 8);
                    }
                    __s = (void *)((long)__s + lVar9);
                    iVar16 = iVar16 + -1;
                  } while (iVar16 != 0);
                }
                bVar24 = iVar3 != (int)local_22d0;
                iVar3 = iVar3 + 1;
              } while (bVar24);
            }
            uVar11 = local_2230 + 1;
            local_2288 = local_2288 + 8;
          } while (uVar11 != 0x13);
        }
        else {
          MultiCutFab::array(&local_2130,local_2208,&local_20f0);
          MultiCutFab::array(&local_2170,local_2210,&local_20f0);
          lVar9 = (long)local_22ac.smallend.vect[2];
          local_22b4 = local_22ac.bigend.vect[2];
          if (local_22ac.smallend.vect[2] <= local_22ac.bigend.vect[2]) {
            local_21e8 = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
            iVar17 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
            local_22c8 = (long)iVar17;
            iVar29 = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
            local_21c8 = (long)iVar29;
            local_21d0 = (long)(((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] -
                                iVar17) + 1);
            local_21f0 = (((this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] -
                          iVar29) + 1) * local_21d0;
            local_2230 = (ulong)(uint)local_22ac.bigend.vect[0];
            local_21e0 = (ulong)(uint)local_22ac.bigend.vect[1];
            local_2218 = (long)local_22ac.smallend.vect[1];
            local_2290 = (long)local_22ac.smallend.vect[0];
            local_21f8 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
            iVar17 = local_22ac.bigend.vect[0] + 1;
            iVar8 = local_22ac.bigend.vect[1] + 1;
            local_22b4 = local_22ac.bigend.vect[2] + 1;
            local_21d8 = local_2290 * 8;
            local_2228 = CONCAT44(local_2228._4_4_,iVar17);
            auVar28 = _DAT_006979c0;
            iVar29 = local_21b8;
            do {
              if ((int)local_2218 <= (int)local_21e0) {
                local_21c0 = local_21e8 + (lVar9 - local_21f8) * local_21f0;
                local_22e8 = local_2218;
                do {
                  pEVar4 = local_21c0;
                  if ((int)local_2290 <= (int)local_2230) {
                    lVar12 = (local_22e8 - local_21c8) * local_21d0;
                    lVar22 = local_21d8;
                    lVar23 = local_2290;
                    do {
                      uVar7 = pEVar4[lVar12 + (lVar23 - local_22c8)].flag & 3;
                      if (uVar7 == 0) {
                        lVar15 = (local_22e8 - local_2270.begin.y) * local_2270.jstride;
                        lVar19 = (lVar9 - local_2270.begin.z) * local_2270.kstride;
                        lVar18 = lVar23 - local_2270.begin.x;
                        local_2270.p[lVar15 + lVar18 + lVar19] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride] = 0.0;
                        local_22d0 = local_2270.nstride * 0x38;
                        local_22c0 = local_2270.nstride * 0x58;
                        local_2288 = local_2270.nstride * 0x68;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 2] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 3] =
                             0.08333333333333333;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 4] =
                             0.08333333333333333;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 5] =
                             0.08333333333333333;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 6] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 7] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 8] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 9] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 10] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0xb] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0xc] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0xd] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0xe] = 0.0;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0xf] =
                             0.006944444444444444;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0x10] =
                             0.006944444444444444;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0x11] =
                             0.006944444444444444;
                        local_2270.p[lVar15 + lVar18 + lVar19 + local_2270.nstride * 0x12] = 0.0;
                        iVar17 = (int)local_2228;
                      }
                      else if (uVar7 == 3) {
                        puVar13 = (undefined8 *)
                                  (lVar22 + (lVar9 - local_2270.begin.z) * local_2270.kstride * 8 +
                                   (local_22e8 - local_2270.begin.y) * local_2270.jstride * 8 +
                                   (long)local_2270.begin.x * -8 + (long)local_2270.p);
                        lVar18 = 0x14;
                        auVar26 = _DAT_006979b0;
                        do {
                          if (SUB164(auVar26 ^ auVar28,4) == iVar29 &&
                              SUB164(auVar26 ^ auVar28,0) < -0x7fffffed) {
                            *puVar13 = 0;
                            puVar13[local_2270.nstride] = 0;
                          }
                          lVar15 = auVar26._8_8_;
                          auVar26._0_8_ = auVar26._0_8_ + 2;
                          auVar26._8_8_ = lVar15 + 2;
                          puVar13 = puVar13 + local_2270.nstride * 2;
                          lVar18 = lVar18 + -2;
                        } while (lVar18 != 0);
                      }
                      else {
                        lVar15 = (local_22e8 - local_2130.begin.y) * local_2130.jstride;
                        lVar19 = (lVar9 - local_2130.begin.z) * local_2130.kstride;
                        lVar18 = lVar23 - local_2130.begin.x;
                        local_21a0.cent.arr[0] = local_2130.p[lVar15 + lVar18 + lVar19];
                        local_21a0.cent.arr[1] =
                             local_2130.p[lVar15 + lVar18 + lVar19 + local_2130.nstride];
                        local_21a0.cent.arr[2] =
                             local_2130.p[lVar15 + lVar18 + lVar19 + local_2130.nstride * 2];
                        lVar18 = lVar23 - local_2170.begin.x;
                        lVar15 = (local_22e8 - local_2170.begin.y) * local_2170.jstride;
                        lVar19 = (lVar9 - local_2170.begin.z) * local_2170.kstride;
                        local_21a0.norm.arr[0] = local_2170.p[lVar15 + lVar18 + lVar19];
                        local_21a0.norm.arr[1] =
                             local_2170.p[lVar15 + lVar18 + lVar19 + local_2170.nstride];
                        local_21a0.norm.arr[2] =
                             local_2170.p[lVar15 + lVar18 + lVar19 + local_2170.nstride * 2];
                        lVar18 = 0;
                        local_2038.nnodes = 0;
                        local_22d4.arr[2] = true;
                        local_22d4.arr[0] = true;
                        local_22d4.arr[1] = true;
                        local_2090.phi = (EBPlane *)0x0;
                        local_2090.f._0_4_ = 0;
                        bVar5 = 0;
                        do {
                          bVar14 = (byte)(1 << ((byte)lVar18 & 0x1f));
                          if (*(int *)((long)&local_2090.free + lVar18 * 4 + -0x10) != 1) {
                            bVar14 = 0;
                          }
                          bVar5 = bVar5 | bVar14;
                          lVar18 = lVar18 + 1;
                        } while (lVar18 != 3);
                        local_22b0.arr = (PsiCode<3>  [4])(bVar5 & 0xfffffff7);
                        ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
                        ::ImplicitIntegral<3,_0>
                                  (&local_2090,&local_21a0,&local_2038,&local_22d4,&local_22b0,1);
                        lVar18 = (long)local_2038.nnodes;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < lVar18) {
                          lVar15 = 0;
                          do {
                            dVar27 = dVar27 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar15)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar15);
                            lVar15 = lVar15 + 0x20;
                          } while (lVar18 << 5 != lVar15);
                        }
                        lVar19 = (local_22e8 - local_2270.begin.y) * local_2270.jstride;
                        lVar15 = (lVar9 - local_2270.begin.z) * local_2270.kstride;
                        lVar20 = lVar23 - local_2270.begin.x;
                        local_2270.p[lVar19 + lVar20 + lVar15] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar25 = dVar25 + *(double *)((long)&local_2038.nodes.arr[0].y + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar27 = dVar27 + *(double *)((long)&local_2038.nodes.arr[0].z + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 2] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].x + lVar21);
                            dVar25 = dVar25 + dVar27 * dVar27 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 3] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].y + lVar21);
                            dVar27 = dVar27 + dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 4] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].z + lVar21);
                            dVar25 = dVar25 + dVar27 * dVar27 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 5] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar27 = dVar27 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].y + lVar21) *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 6] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar25 = dVar25 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].z + lVar21) *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 7] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar27 = dVar27 + *(double *)((long)&local_2038.nodes.arr[0].y + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].z + lVar21) *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 8] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].x + lVar21);
                            dVar25 = dVar25 + dVar27 * dVar27 *
                                              *(double *)((long)&local_2038.nodes.arr[0].y + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 9] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].x + lVar21);
                            dVar27 = dVar27 + dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].z + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 10] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].y + lVar21);
                            dVar25 = dVar25 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar21)
                                              * dVar27 * dVar27 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0xb] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].y + lVar21);
                            dVar27 = dVar27 + dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].z + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0xc] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].z + lVar21);
                            dVar25 = dVar25 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar21)
                                              * dVar27 * dVar27 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0xd] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].z + lVar21);
                            dVar27 = dVar27 + *(double *)((long)&local_2038.nodes.arr[0].y + lVar21)
                                              * dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0xe] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].x + lVar21);
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].y + lVar21);
                            dVar25 = dVar25 + dVar27 * dVar27 * dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0xf] = dVar25;
                        dVar25 = 0.0;
                        dVar27 = 0.0;
                        if (0 < local_2038.nnodes) {
                          lVar21 = 0;
                          do {
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].x + lVar21);
                            dVar2 = *(double *)((long)&local_2038.nodes.arr[0].z + lVar21);
                            dVar27 = dVar27 + dVar1 * dVar1 * dVar2 * dVar2 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0x10] = dVar27;
                        if (0 < local_2038.nnodes) {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar27 = *(double *)((long)&local_2038.nodes.arr[0].y + lVar21);
                            dVar1 = *(double *)((long)&local_2038.nodes.arr[0].z + lVar21);
                            dVar25 = dVar25 + dVar27 * dVar27 * dVar1 * dVar1 *
                                              *(double *)((long)&local_2038.nodes.arr[0].w + lVar21)
                            ;
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 << 5 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0x11] = dVar25;
                        auVar28 = _DAT_006979c0;
                        if (local_2038.nnodes < 1) {
                          dVar25 = 0.0;
                        }
                        else {
                          dVar25 = 0.0;
                          lVar21 = 0;
                          do {
                            dVar25 = dVar25 + *(double *)((long)&local_2038.nodes.arr[0].x + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].y + lVar21) *
                                              *(double *)((long)&local_2038.nodes.arr[0].z + lVar21)
                                              * *(double *)
                                                 ((long)&local_2038.nodes.arr[0].w + lVar21);
                            lVar21 = lVar21 + 0x20;
                          } while (lVar18 * 0x20 != lVar21);
                        }
                        local_2270.p[lVar19 + lVar20 + lVar15 + local_2270.nstride * 0x12] = dVar25;
                        iVar29 = local_21b8;
                      }
                      lVar23 = lVar23 + 1;
                      lVar22 = lVar22 + 8;
                    } while (iVar17 != (int)lVar23);
                  }
                  local_22e8 = local_22e8 + 1;
                } while (iVar8 != (int)local_22e8);
              }
              lVar9 = lVar9 + 1;
            } while (local_22b4 != (int)lVar9);
          }
        }
        MFIter::operator++(&local_20f0);
      } while (local_20f0.currentIndex < local_20f0.endIndex);
    }
    MFIter::~MFIter(&local_20f0);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
compute_integrals (MultiFab& intgmf, IntVect nghost)
{
#if (AMREX_SPACEDIM == 2)
    amrex::ignore_unused(intgmf, nghost);
    amrex::Abort("amrex::algoim::compute_integrals is 3D only");
#else

    nghost.min(intgmf.nGrowVect());
    AMREX_ASSERT(intgmf.nComp() >= numIntgs);

    const auto& my_factory = dynamic_cast<EBFArrayBoxFactory const&>(intgmf.Factory());

    // const MultiFab&    vfrac = my_factory.getVolFrac();
    const MultiCutFab& bcent = my_factory.getBndryCent();
    const MultiCutFab& bnorm = my_factory.getBndryNormal();
    const auto&        flags = my_factory.getMultiEBCellFlagFab();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(intgmf,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        Array4<Real> const& intg = intgmf.array(mfi);

        const auto& flagfab = flags[mfi];
        auto typ = flagfab.getType(bx);

        if (typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_FOR_4D ( bx, numIntgs, i, j, k, n,
            {
                intg(i,j,k,n) = 0.0;
            });
        }
        else if (typ == FabType::regular)
        {
            AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
            {
                set_regular(i,j,k,intg);
            });
        }
        else
        {
            // auto const& vf = vfrac.array(mfi);
            auto const& bc = bcent.array(mfi);
            auto const& bn = bnorm.array(mfi);
            auto const& fg = flagfab.array();

            if (Gpu::inLaunchRegion())
            {
                amrex::ParallelFor(bx,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                });
            }
            else
            {
                const auto lo = amrex::lbound(bx);
                const auto hi = amrex::ubound(bx);
                for (int k = lo.z; k <= hi.z; ++k)
                for (int j = lo.y; j <= hi.y; ++j)
                for (int i = lo.x; i <= hi.x; ++i)
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q.eval([](Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                }
            }
        }
    }
#endif
}